

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_27de14::PeerManagerImpl::BlockChecked
          (PeerManagerImpl *this,CBlock *block,BlockValidationState *state)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  byte bVar3;
  ModeState MVar4;
  NodeId nodeid;
  _List_node_base *id;
  _List_node_base *p_Var5;
  function<bool_(CNode_*)> func;
  _List_node_base **pp_Var6;
  bool bVar7;
  iterator __position;
  size_type sVar8;
  _List_node_base *p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  _List_node_base *p_Var13;
  _Base_ptr p_Var14;
  uint uVar15;
  _Base_ptr p_Var16;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock46;
  uint256 hash;
  undefined8 in_stack_ffffffffffffff68;
  _Rb_tree_header *in_stack_ffffffffffffff70;
  RecursiveMutex *pRVar17;
  bool bVar18;
  undefined7 in_stack_ffffffffffffff81;
  uint256 local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  uint64_t local_38;
  
  local_38 = *(uint64_t *)(in_FS_OFFSET + 0x28);
  pRVar17 = &cs_main;
  bVar18 = false;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffff78);
  CBlockHeader::GetHash(&local_78,&block->super_CBlockHeader);
  __position = std::
               _Rb_tree<uint256,_std::pair<const_uint256,_std::pair<long,_bool>_>,_std::_Select1st<std::pair<const_uint256,_std::pair<long,_bool>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
               ::find(&(this->mapBlockSource)._M_t,&local_78);
  MVar4 = (state->super_ValidationState<BlockValidationResult>).m_mode;
  p_Var14 = &(this->mapBlockSource)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (__position._M_node != p_Var14 && MVar4 == M_INVALID) {
    nodeid = *(NodeId *)(__position._M_node + 2);
    p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
    p_Var10 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var11 = &p_Var1->_M_header;
    for (; p_Var10 != (_Base_ptr)0x0; p_Var10 = (&p_Var10->_M_left)[*(long *)(p_Var10 + 1) < nodeid]
        ) {
      if (nodeid <= *(long *)(p_Var10 + 1)) {
        p_Var11 = p_Var10;
      }
    }
    p_Var10 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
       (p_Var10 = p_Var11, nodeid < *(long *)(p_Var11 + 1))) {
      p_Var10 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var10 != p_Var1) {
      bVar3 = *(byte *)&__position._M_node[2]._M_parent;
      local_58._0_8_ = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
      MaybePunishNodeForBlock(this,nodeid,state,(bool)(bVar3 ^ 1),(string *)local_58);
      if ((PeerManagerImpl *)local_58._0_8_ != (PeerManagerImpl *)local_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(local_48._0_8_ + 1));
      }
      goto LAB_001c6e61;
    }
  }
  if ((((MVar4 == M_VALID) &&
       (bVar7 = ChainstateManager::IsInitialBlockDownload(this->m_chainman), !bVar7)) &&
      (sVar8 = std::
               multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
               ::count(&this->mapBlocksInFlight,&local_78),
      __position._M_node != p_Var14 &&
      sVar8 == (this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count)) &&
     ((this->m_opts).ignore_incoming_txs == false)) {
    id = *(_List_node_base **)(__position._M_node + 2);
    p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
    p_Var10 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var11 = p_Var10;
    p_Var12 = &p_Var1->_M_header;
    for (; p_Var11 != (_Base_ptr)0x0;
        p_Var11 = (&p_Var11->_M_left)[*(long *)(p_Var11 + 1) < (long)id]) {
      if ((long)id <= *(long *)(p_Var11 + 1)) {
        p_Var12 = p_Var11;
      }
    }
    p_Var11 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
       (p_Var11 = p_Var12, (long)id < *(long *)(p_Var12 + 1))) {
      p_Var11 = &p_Var1->_M_header;
    }
    if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
       (*(char *)((long)&p_Var11[4]._M_left + 2) == '\x01')) {
      p_Var5 = (this->lNodesAnnouncingHeaderAndIDs).super__List_base<long,_std::allocator<long>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      uVar15 = 0;
      p_Var13 = p_Var5;
      if (p_Var5 != (_List_node_base *)&this->lNodesAnnouncingHeaderAndIDs) {
        do {
          p_Var9 = (_List_node_base *)p_Var13[1]._M_next;
          p_Var12 = p_Var10;
          p_Var16 = &p_Var1->_M_header;
          if (p_Var9 == id) {
            psVar2 = &(this->lNodesAnnouncingHeaderAndIDs).
                      super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size;
            *psVar2 = *psVar2 - 1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(p_Var13,0x18);
            p_Var9 = (_List_node_base *)operator_new(0x18);
            p_Var9[1]._M_next = id;
            std::__detail::_List_node_base::_M_hook(p_Var9);
            psVar2 = &(this->lNodesAnnouncingHeaderAndIDs).
                      super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size;
            *psVar2 = *psVar2 + 1;
            goto LAB_001c6e61;
          }
          for (; p_Var12 != (_Base_ptr)0x0;
              p_Var12 = (&p_Var12->_M_left)[*(long *)(p_Var12 + 1) < (long)p_Var9]) {
            if ((long)p_Var9 <= *(long *)(p_Var12 + 1)) {
              p_Var16 = p_Var12;
            }
          }
          p_Var12 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var16 != p_Var1) &&
             (p_Var12 = p_Var16, (long)p_Var9 < *(long *)(p_Var16 + 1))) {
            p_Var12 = &p_Var1->_M_header;
          }
          if ((_Rb_tree_header *)p_Var12 != p_Var1) {
            uVar15 = uVar15 + (*(byte *)&p_Var12[5]._M_right ^ 1);
          }
          pp_Var6 = &p_Var13->_M_next;
          p_Var13 = *pp_Var6;
        } while (*pp_Var6 != (_List_node_base *)&this->lNodesAnnouncingHeaderAndIDs);
        uVar15 = (uint)(uVar15 == 1);
        in_stack_ffffffffffffff70 = (_Rb_tree_header *)p_Var14;
      }
      if ((*(char *)&p_Var11[5]._M_right == '\x01') &&
         ((2 < (this->lNodesAnnouncingHeaderAndIDs).super__List_base<long,_std::allocator<long>_>.
               _M_impl._M_node._M_size & (byte)uVar15) == 1)) {
        p_Var13 = p_Var5[1]._M_next;
        p_Var11 = &p_Var1->_M_header;
        for (; p_Var10 != (_Base_ptr)0x0;
            p_Var10 = (&p_Var10->_M_left)[*(long *)(p_Var10 + 1) < (long)p_Var13]) {
          if ((long)p_Var13 <= *(long *)(p_Var10 + 1)) {
            p_Var11 = p_Var10;
          }
        }
        p_Var10 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
           (p_Var10 = p_Var11, (long)p_Var13 < *(long *)(p_Var11 + 1))) {
          p_Var10 = &p_Var1->_M_header;
        }
        if (((_Rb_tree_header *)p_Var10 != p_Var1) && (*(char *)&p_Var10[5]._M_right == '\0')) {
          p_Var5[1]._M_next = p_Var5->_M_next[1]._M_next;
          p_Var5->_M_next[1]._M_next = p_Var13;
        }
      }
      local_58._8_8_ = 0;
      local_48._8_8_ =
           std::
           _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:1422:31)>
           ::_M_invoke;
      local_48._0_8_ =
           std::
           _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:1422:31)>
           ::_M_manager;
      func.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff70;
      func.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff68;
      func.super__Function_base._M_manager = (_Manager_type)pRVar17;
      func._M_invoker._0_1_ = bVar18;
      func._M_invoker._1_7_ = in_stack_ffffffffffffff81;
      local_58._0_8_ = this;
      CConnman::ForNode(this->m_connman,(NodeId)id,func);
      if ((_func_int **)local_48._0_8_ != (_func_int **)0x0) {
        (*(code *)local_48._0_8_)(local_58,local_58,3);
      }
    }
  }
LAB_001c6e61:
  if (__position._M_node != p_Var14) {
    std::
    _Rb_tree<uint256,std::pair<uint256_const,std::pair<long,bool>>,std::_Select1st<std::pair<uint256_const,std::pair<long,bool>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
    ::erase_abi_cxx11_((_Rb_tree<uint256,std::pair<uint256_const,std::pair<long,bool>>,std::_Select1st<std::pair<uint256_const,std::pair<long,bool>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
                        *)&this->mapBlockSource,__position);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffff78);
  if (*(uint64_t *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::BlockChecked(const CBlock& block, const BlockValidationState& state)
{
    LOCK(cs_main);

    const uint256 hash(block.GetHash());
    std::map<uint256, std::pair<NodeId, bool>>::iterator it = mapBlockSource.find(hash);

    // If the block failed validation, we know where it came from and we're still connected
    // to that peer, maybe punish.
    if (state.IsInvalid() &&
        it != mapBlockSource.end() &&
        State(it->second.first)) {
            MaybePunishNodeForBlock(/*nodeid=*/ it->second.first, state, /*via_compact_block=*/ !it->second.second);
    }
    // Check that:
    // 1. The block is valid
    // 2. We're not in initial block download
    // 3. This is currently the best block we're aware of. We haven't updated
    //    the tip yet so we have no way to check this directly here. Instead we
    //    just check that there are currently no other blocks in flight.
    else if (state.IsValid() &&
             !m_chainman.IsInitialBlockDownload() &&
             mapBlocksInFlight.count(hash) == mapBlocksInFlight.size()) {
        if (it != mapBlockSource.end()) {
            MaybeSetPeerAsAnnouncingHeaderAndIDs(it->second.first);
        }
    }
    if (it != mapBlockSource.end())
        mapBlockSource.erase(it);
}